

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  __m256i alVar9;
  __m256i alVar10;
  undefined1 auVar11 [32];
  uint uVar12;
  uint uVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  __m256i *palVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  __m256i *palVar25;
  bool bVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  undefined8 uVar33;
  ulong uVar34;
  long lVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar58 [16];
  int local_fc;
  undefined1 auVar38 [32];
  
  auVar40 = in_ZMM14._0_16_;
  auVar55 = in_ZMM13._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_1();
        }
        else {
          uVar13 = uVar3 - 1;
          uVar32 = (ulong)uVar3 + 3;
          uVar34 = uVar32 >> 2;
          uVar7 = (ulong)uVar13 % uVar34;
          iVar14 = (int)(uVar13 / uVar34);
          iVar16 = -open;
          iVar17 = ppVar5->min;
          uVar22 = 0x8000000000000000 - (long)iVar17;
          if (iVar17 != iVar16 && SBORROW4(iVar17,iVar16) == iVar17 + open < 0) {
            uVar22 = CONCAT44(0,open) | 0x8000000000000000;
          }
          iVar17 = ppVar5->max;
          ppVar15 = parasail_result_new_table1((uint)uVar32 & 0x7ffffffc,s2Len);
          if (ppVar15 != (parasail_result_t *)0x0) {
            ppVar15->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar15->flag | 0x4820402;
            ptr = parasail_memalign___m256i(0x20,uVar34);
            ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,uVar34);
            ptr_02 = parasail_memalign___m256i(0x20,uVar34);
            ptr_03 = parasail_memalign___m256i(0x20,uVar34);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar1 = s2Len + -1;
              iVar30 = -iVar14 + 3;
              auVar48._8_4_ = open;
              auVar48._0_8_ = CONCAT44(0,open);
              auVar48._12_4_ = 0;
              auVar48._16_4_ = open;
              auVar48._20_4_ = 0;
              auVar48._24_4_ = open;
              auVar48._28_4_ = 0;
              auVar49._8_4_ = gap;
              auVar49._0_8_ = CONCAT44(0,gap);
              auVar49._12_4_ = 0;
              auVar49._16_4_ = gap;
              auVar49._20_4_ = 0;
              auVar49._24_4_ = gap;
              auVar49._28_4_ = 0;
              uVar22 = uVar22 + 1;
              lVar24 = 0x7ffffffffffffffe - (long)iVar17;
              auVar37._8_8_ = uVar22;
              auVar37._0_8_ = uVar22;
              auVar38._16_8_ = uVar22;
              auVar38._0_16_ = auVar37;
              auVar38._24_8_ = uVar22;
              uVar27 = (uint)uVar34;
              lVar23 = (long)(int)-(uVar27 * gap);
              auVar41._8_8_ = lVar23;
              auVar41._0_8_ = lVar23;
              auVar41._16_8_ = lVar23;
              auVar41._24_8_ = lVar23;
              auVar41 = vpblendd_avx2(auVar41,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar41 = vpaddq_avx2(ZEXT832(uVar22),auVar41);
              bVar36 = s1_beg != 0;
              lVar23 = (long)iVar16;
              auVar42._4_4_ = uVar27;
              auVar42._0_4_ = uVar27;
              auVar42._8_4_ = uVar27;
              auVar42._12_4_ = uVar27;
              auVar42._16_4_ = uVar27;
              auVar42._20_4_ = uVar27;
              auVar42._24_4_ = uVar27;
              auVar42._28_4_ = uVar27;
              auVar46._8_4_ = gap;
              auVar46._0_8_ = CONCAT44(0,gap);
              auVar46._12_4_ = 0;
              auVar46._16_4_ = gap;
              auVar46._20_4_ = 0;
              auVar46._24_4_ = gap;
              auVar46._28_4_ = 0;
              auVar53._8_8_ = lVar23;
              auVar53._0_8_ = lVar23;
              auVar53._16_8_ = lVar23;
              auVar53._24_8_ = lVar23;
              auVar44 = vpmuldq_avx2(auVar42,_DAT_00908b60);
              auVar39[1] = bVar36;
              auVar39[0] = bVar36;
              auVar39[2] = bVar36;
              auVar39[3] = bVar36;
              auVar39[4] = bVar36;
              auVar39[5] = bVar36;
              auVar39[6] = bVar36;
              auVar39[7] = bVar36;
              auVar39[8] = bVar36;
              auVar39[9] = bVar36;
              auVar39[10] = bVar36;
              auVar39[0xb] = bVar36;
              auVar39[0xc] = bVar36;
              auVar39[0xd] = bVar36;
              auVar39[0xe] = bVar36;
              auVar39[0xf] = bVar36;
              uVar18 = 0;
              auVar39 = vpslld_avx(auVar39,0x1f);
              auVar39 = vpsrad_avx(auVar39,0x1f);
              auVar42 = vpmovsxdq_avx2(auVar39);
              palVar20 = ptr_02;
              palVar25 = ptr;
              do {
                auVar43._8_8_ = uVar18;
                auVar43._0_8_ = uVar18;
                auVar43._16_8_ = uVar18;
                auVar43._24_8_ = uVar18;
                auVar43 = vpaddq_avx2(auVar44,auVar43);
                auVar57 = vpmuludq_avx2(auVar43,auVar46);
                auVar43 = vpsrlq_avx2(auVar43,0x20);
                auVar43 = vpmuludq_avx2(auVar43,auVar46);
                auVar43 = vpsllq_avx2(auVar43,0x20);
                auVar43 = vpaddq_avx2(auVar57,auVar43);
                auVar43 = vpsubq_avx2(auVar53,auVar43);
                alVar9 = (__m256i)vpandn_avx2(auVar42,auVar43);
                alVar10 = (__m256i)vpsubq_avx2((undefined1  [32])alVar9,auVar48);
                *palVar20 = alVar9;
                *palVar25 = alVar10;
                uVar18 = uVar18 + 1;
                palVar25 = palVar25 + 1;
                palVar20 = palVar20 + 1;
              } while (uVar34 != uVar18);
              *ptr_00 = 0;
              uVar18 = (ulong)(uint)s2Len;
              lVar23 = uVar18 - 1;
              auVar44._8_8_ = lVar23;
              auVar44._0_8_ = lVar23;
              auVar44._16_8_ = lVar23;
              auVar44._24_8_ = lVar23;
              auVar45._4_4_ = gap;
              auVar45._0_4_ = gap;
              auVar45._8_4_ = gap;
              auVar45._12_4_ = gap;
              auVar52._4_4_ = iVar16;
              auVar52._0_4_ = iVar16;
              auVar52._8_4_ = iVar16;
              auVar52._12_4_ = iVar16;
              auVar39 = vpmovsxbd_avx(ZEXT416(0x4030201));
              uVar19 = 0;
              auVar42 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar57._8_8_ = 0x8000000000000000;
              auVar57._0_8_ = 0x8000000000000000;
              auVar57._16_8_ = 0x8000000000000000;
              auVar57._24_8_ = 0x8000000000000000;
              auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
              auVar40 = vpcmpeqd_avx(auVar40,auVar40);
              auVar58._8_4_ = 4;
              auVar58._0_8_ = 0x400000004;
              auVar58._12_4_ = 4;
              do {
                if (s2_beg == 0) {
                  auVar8 = vpaddd_avx(auVar39,auVar40);
                  auVar8 = vpmulld_avx(auVar8,auVar45);
                  auVar8 = vpsubd_avx(auVar52,auVar8);
                  auVar46 = vpmovsxdq_avx2(auVar8);
                }
                else {
                  auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar50._8_8_ = uVar19;
                auVar50._0_8_ = uVar19;
                auVar50._16_8_ = uVar19;
                auVar50._24_8_ = uVar19;
                auVar53 = vpor_avx2(auVar42,auVar50);
                auVar53 = vpcmpgtq_avx2(auVar57 ^ auVar53,auVar57 ^ auVar44);
                auVar46 = vpmaskmovq_avx2(auVar55 ^ auVar53,auVar46);
                *(undefined1 (*) [32])(ptr_00 + uVar19 + 1) = auVar46;
                uVar19 = uVar19 + 4;
                auVar39 = vpaddd_avx(auVar39,auVar58);
              } while ((s2Len + 3U & 0xfffffffc) != uVar19);
              alVar9 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar48);
              palVar20 = ptr_03 + (uVar27 - 1);
              auVar47 = ZEXT3264(CONCAT824(lVar24,CONCAT816(lVar24,CONCAT88(lVar24,lVar24))));
              uVar19 = uVar34;
              do {
                *palVar20 = alVar9;
                alVar9 = (__m256i)vpsubq_avx2((undefined1  [32])alVar9,auVar49);
                auVar55 = vpcmpgtq_avx2((undefined1  [32])alVar9,auVar47._0_32_);
                auVar55 = vblendvpd_avx((undefined1  [32])alVar9,auVar47._0_32_,auVar55);
                auVar47 = ZEXT3264(auVar55);
                palVar20 = palVar20 + -1;
                iVar17 = (int)uVar19;
                uVar21 = iVar17 - 1;
                uVar19 = (ulong)uVar21;
              } while (uVar21 != 0 && 0 < iVar17);
              lVar35 = uVar34 * uVar18;
              lVar23 = 0;
              auVar55._0_8_ = -(ulong)(iVar30 == 3);
              auVar55._8_8_ = -(ulong)(iVar30 == 2);
              auVar55._16_8_ = -(ulong)(iVar30 == 1);
              auVar55._24_8_ = -(ulong)(-iVar14 == -3);
              auVar54 = ZEXT3264(auVar38);
              auVar51 = ZEXT3264(auVar38);
              uVar19 = 0;
              local_fc = iVar1;
              do {
                auVar40 = SUB3216(ptr_02[uVar27 - 1],0);
                auVar56._0_16_ = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar37;
                auVar56._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar40;
                auVar42 = vpalignr_avx2((undefined1  [32])ptr_02[uVar27 - 1],auVar56,8);
                auVar42 = vpblendd_avx2(auVar42,ZEXT832((ulong)ptr_00[uVar19]),3);
                iVar17 = ppVar5->mapper[(byte)s2[uVar19]];
                auVar46 = vpsubq_avx2(auVar38,(undefined1  [32])*ptr_03);
                lVar31 = 0;
                auVar44 = auVar38;
                do {
                  auVar43 = vpaddq_avx2(auVar42,*(undefined1 (*) [32])
                                                 ((long)pvVar4 +
                                                 lVar31 + (long)iVar17 * uVar34 * 0x20));
                  auVar42 = *(undefined1 (*) [32])((long)*ptr_02 + lVar31);
                  auVar57 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar31),auVar49);
                  auVar46 = vpaddq_avx2(auVar46,*(undefined1 (*) [32])((long)*ptr_03 + lVar31));
                  auVar50 = vpsubq_avx2(auVar42,auVar48);
                  auVar53 = vpcmpgtq_avx2(auVar44,auVar46);
                  auVar44 = vblendvpd_avx(auVar46,auVar44,auVar53);
                  auVar46 = vpcmpgtq_avx2(auVar57,auVar50);
                  auVar53 = vblendvpd_avx(auVar50,auVar57,auVar46);
                  auVar46 = vpcmpgtq_avx2(auVar53,auVar43);
                  auVar46 = vblendvpd_avx(auVar43,auVar53,auVar46);
                  *(undefined1 (*) [32])((long)*ptr + lVar31) = auVar53;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar31) = auVar46;
                  lVar31 = lVar31 + 0x20;
                } while (uVar34 << 5 != lVar31);
                auVar53 = vpermpd_avx2(auVar46,0x90);
                uVar2 = uVar19 + 1;
                auVar42 = vblendpd_avx(auVar53,ZEXT832((ulong)ptr_00[uVar19 + 1]),1);
                auVar42 = vpaddq_avx2(auVar42,(undefined1  [32])*ptr_03);
                auVar46 = vpcmpgtq_avx2(auVar44,auVar42);
                auVar42 = vblendvpd_avx(auVar42,auVar44,auVar46);
                bVar36 = true;
                do {
                  bVar26 = bVar36;
                  auVar44 = vperm2f128_avx(auVar42,auVar42,8);
                  auVar44 = vpalignr_avx2(auVar42,auVar44,8);
                  auVar44 = vpaddq_avx2(auVar41,auVar44);
                  auVar46 = vpcmpgtq_avx2(auVar42,auVar44);
                  auVar42 = vblendvpd_avx(auVar44,auVar42,auVar46);
                  bVar36 = false;
                } while (bVar26);
                auVar44 = vperm2f128_avx(auVar42,auVar42,8);
                auVar42 = vpalignr_avx2(auVar42,auVar44,8);
                auVar44 = vpaddq_avx2(ZEXT832(uVar22),auVar42);
                auVar42 = vblendpd_avx(auVar53,ZEXT832((ulong)ptr_00[uVar19 + 1]),1);
                auVar46 = vpcmpgtq_avx2(auVar42,auVar44);
                auVar42 = vblendvpd_avx(auVar44,auVar42,auVar46);
                lVar29 = 0;
                lVar31 = lVar23;
                do {
                  auVar44 = vpsubq_avx2(auVar44,auVar49);
                  auVar46 = vpsubq_avx2(auVar42,auVar48);
                  auVar42 = vpcmpgtq_avx2(auVar44,auVar46);
                  auVar44 = vblendvpd_avx(auVar46,auVar44,auVar42);
                  auVar42 = *(undefined1 (*) [32])((long)*ptr_01 + lVar29);
                  auVar46 = vpcmpgtq_avx2(auVar42,auVar44);
                  auVar42 = vblendvpd_avx(auVar44,auVar42,auVar46);
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar29) = auVar42;
                  auVar46 = vpcmpgtq_avx2(auVar42,auVar47._0_32_);
                  auVar46 = vblendvpd_avx(auVar42,auVar47._0_32_,auVar46);
                  auVar53 = vpcmpgtq_avx2(auVar44,auVar46);
                  auVar46 = vblendvpd_avx(auVar44,auVar46,auVar53);
                  auVar47 = ZEXT3264(auVar46);
                  auVar53 = vpcmpgtq_avx2(auVar51._0_32_,auVar42);
                  auVar53 = vblendvpd_avx(auVar42,auVar51._0_32_,auVar53);
                  auVar51 = ZEXT3264(auVar53);
                  piVar6 = ((ppVar15->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar31) = auVar42._0_4_;
                  *(int *)((long)piVar6 + lVar35 * 4 + lVar31) = auVar42._8_4_;
                  *(int *)((long)piVar6 + lVar35 * 8 + lVar31) = auVar42._16_4_;
                  *(int *)((long)piVar6 + lVar35 * 0xc + lVar31) = auVar42._24_4_;
                  lVar29 = lVar29 + 0x20;
                  lVar31 = lVar31 + uVar18 * 4;
                } while (uVar34 << 5 != lVar29);
                auVar44 = vpcmpgtq_avx2((undefined1  [32])ptr_02[uVar7],auVar54._0_32_);
                auVar42 = vblendvpd_avx(auVar54._0_32_,(undefined1  [32])ptr_02[uVar7],auVar44);
                auVar40 = auVar42._16_16_;
                auVar54 = ZEXT3264(auVar42);
                auVar44 = auVar55 & auVar44;
                if ((((auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar44 >> 0x7f,0) != '\0') || SUB321(auVar44 >> 0xbf,0) != '\0') ||
                    auVar44[0x1f] < '\0') {
                  local_fc = (int)uVar19;
                }
                lVar23 = lVar23 + 4;
                uVar19 = uVar2;
              } while (uVar2 != uVar18);
              if (s2_end != 0) {
                if (iVar14 < 3) {
                  iVar17 = 0;
                  do {
                    auVar41 = auVar54._0_32_;
                    auVar55 = vperm2i128_avx2(auVar41,auVar41,8);
                    auVar55 = vpalignr_avx2(auVar41,auVar55,8);
                    auVar40 = auVar55._16_16_;
                    auVar54 = ZEXT3264(auVar55);
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < iVar30);
                }
                uVar22 = vpextrq_avx(auVar40,1);
              }
              uVar21 = uVar13;
              if ((s1_end != 0) && ((uVar32 & 0x7ffffffc) != 0)) {
                uVar34 = 0;
                uVar32 = uVar22;
                do {
                  uVar28 = ((uint)uVar34 & 3) * uVar27 + ((uint)(uVar34 >> 2) & 0x3fffffff);
                  uVar22 = uVar32;
                  uVar12 = uVar21;
                  iVar17 = local_fc;
                  if (((int)uVar28 < (int)uVar3) &&
                     (uVar22 = (*ptr_02)[uVar34], uVar12 = uVar28, iVar17 = iVar1,
                     (long)uVar22 <= (long)uVar32)) {
                    if ((int)uVar21 <= (int)uVar28) {
                      uVar28 = uVar21;
                    }
                    if (local_fc != iVar1) {
                      uVar28 = uVar21;
                    }
                    bVar36 = uVar22 == uVar32;
                    uVar22 = uVar32;
                    uVar12 = uVar21;
                    iVar17 = local_fc;
                    if (bVar36) {
                      uVar12 = uVar28;
                    }
                  }
                  local_fc = iVar17;
                  uVar21 = uVar12;
                  uVar34 = uVar34 + 1;
                  uVar32 = uVar22;
                } while ((uVar27 & 0x1fffffff) << 2 != (int)uVar34);
              }
              iVar17 = (int)uVar22;
              if (s2_end == 0 && s1_end == 0) {
                alVar9 = ptr_02[uVar7];
                auVar40 = alVar9._16_16_;
                if (iVar14 < 3) {
                  iVar17 = 0;
                  do {
                    auVar55 = vperm2i128_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar9,8);
                    alVar9 = (__m256i)vpalignr_avx2((undefined1  [32])alVar9,auVar55,8);
                    auVar40 = alVar9._16_16_;
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < iVar30);
                }
                uVar33 = vpextrq_avx(auVar40,1);
                iVar17 = (int)uVar33;
                uVar21 = uVar13;
                local_fc = iVar1;
              }
              auVar55 = vpcmpgtq_avx2(auVar38,auVar46);
              auVar11._8_8_ = lVar24;
              auVar11._0_8_ = lVar24;
              auVar11._16_8_ = lVar24;
              auVar11._24_8_ = lVar24;
              auVar41 = vpcmpgtq_avx2(auVar53,auVar11);
              auVar55 = vpor_avx2(auVar41,auVar55);
              if ((((auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar55 >> 0x7f,0) != '\0') || SUB321(auVar55 >> 0xbf,0) != '\0') ||
                  auVar55[0x1f] < '\0') {
                *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                iVar17 = 0;
                local_fc = 0;
                uVar21 = 0;
              }
              ppVar15->score = iVar17;
              ppVar15->end_query = uVar21;
              ppVar15->end_ref = local_fc;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar15;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}